

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dLog(uint indent,char *format,...)

{
  char in_AL;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  __va_list_tag *args_00;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  string local_90;
  undefined1 local_59 [33];
  char local_38 [8];
  va_list args;
  char *format_local;
  uint indent_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_148;
  args[0]._0_8_ = &stack0x00000008;
  local_38[4] = '0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[0] = '\x10';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  args_00 = (__va_list_tag *)local_59;
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_59 + 1),(ulong)(indent * 2),' ',(allocator *)args_00);
  uVar1 = std::__cxx11::string::data();
  chatra::formatTextV_abi_cxx11_(&local_90,(chatra *)format,local_38,args_00);
  uVar2 = std::__cxx11::string::data();
  printf("%s%s\n",uVar1,uVar2);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  fflush(_stdout);
  return;
}

Assistant:

static void dLog(unsigned indent, const char* format, ...) {
	va_list args;
	va_start(args, format);
	std::printf("%s%s\n", std::string(indent * 2, ' ').data(), cha::formatTextV(format, args).data());
	std::fflush(stdout);
	va_end(args);
}